

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.c
# Opt level: O1

void setPagesRX(void *ptr,size_t bytes)

{
  mprotect(ptr,bytes,5);
  return;
}

Assistant:

void setPagesRX(void* ptr, size_t bytes) {
	char *errfunc;
#if defined(USE_PTHREAD_JIT_WP) && defined(MAC_OS_VERSION_11_0) \
	&& MAC_OS_X_VERSION_MAX_ALLOWED >= MAC_OS_VERSION_11_0
	if (__builtin_available(macOS 11.0, *)) {
		pthread_jit_write_protect_np(1);
		__builtin___clear_cache((char*)ptr, ((char*)ptr) + bytes);
	} else {
		pageProtect(ptr, bytes, PAGE_EXECUTE_READ, &errfunc);
	}
#else
	pageProtect(ptr, bytes, PAGE_EXECUTE_READ, &errfunc);
#endif
}